

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double Jmyy,double Jmzz,double Jmyz,
          double mass_phi,double Qmy,double Qmz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  EigenMat5x1 J_vec;
  EigenMat5x1 const_vec;
  EigenMat5x1 Jm_vec;
  EigenMat5x5 Acog2cl;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_const_Eigen::Product<Eigen::Matrix<double,_5,_5,_0,_5,_5>,_Eigen::Matrix<double,_5,_1,_0,_5,_1>,_0>_>
  local_188;
  double local_168;
  double dStack_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  Matrix<double,_5,_1,_0,_5,_1> local_118;
  double local_f0;
  undefined8 local_e8;
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined8 local_a8;
  double local_90;
  double local_88;
  double local_80;
  double local_68;
  double local_60;
  double local_58;
  double local_40;
  undefined8 local_38;
  double local_30;
  
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       Qmy;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[1] =
       Qmz;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[2] =
       Jmyy;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[3] =
       Jmzz;
  local_118.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       Jmyz;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_140);
  local_140 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.mu;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_140;
  local_128 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.My;
  dStack_120 = (this->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  local_140 = local_140 *
              (this->super_ChBeamSectionRayleighAdvancedGeneric).
              super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_140;
  auVar6 = vunpcklpd_avx(auVar6,auVar10);
  local_138 = local_128 * auVar6._0_8_;
  dStack_130 = dStack_120 * auVar6._8_8_;
  local_128 = local_128 * local_138;
  dStack_120 = dStack_120 * local_138;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)&local_f0);
  dVar3 = cos(mass_phi);
  dVar4 = sin(mass_phi);
  dVar5 = cos(mass_phi + mass_phi);
  local_40 = sin(mass_phi + mass_phi);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  auVar11._0_8_ = -dVar4;
  auVar11._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
  local_88 = dVar4 * dVar4;
  local_90 = dVar3 * dVar3;
  local_e8 = vmovlpd_avx(auVar11);
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  local_e0 = dVar3 * (dVar1 + dVar1);
  local_b8 = dVar4 * (dVar1 + dVar1);
  dVar2 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  local_d8 = dVar4 * dVar2 * -2.0;
  local_b0 = dVar3 * (dVar2 + dVar2);
  auVar7._0_8_ = -local_40;
  auVar7._8_8_ = extraout_XMM0_Qb_00 ^ 0x8000000000000000;
  local_38 = vmovlpd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar4 * dVar1;
  auVar6 = vfmsub231sd_fma(auVar8,auVar13,auVar14);
  local_d0 = auVar6._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * dVar2;
  auVar6 = vfmadd231sd_fma(auVar9,auVar12,auVar14);
  local_a8 = auVar6._0_8_;
  local_80 = local_40 * -0.5;
  local_58 = local_40 * 0.5;
  local_f0 = dVar3;
  local_c8 = dVar4;
  local_c0 = dVar3;
  local_68 = local_88;
  local_60 = local_90;
  local_30 = dVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)&local_168);
  local_188.m_lhs = (LhsNested)&local_140;
  local_188.m_rhs.m_lhs = (LhsNested)&local_f0;
  local_188.m_rhs.m_rhs = &local_118;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,5,1,0,5,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,5,1,0,5,1>const,Eigen::Product<Eigen::Matrix<double,5,5,0,5,5>,Eigen::Matrix<double,5,1,0,5,1>,0>const>>
            ((Matrix<double,_5,_1,_0,_5,_1> *)&local_168,&local_188);
  this->Qy = local_168;
  this->Qz = dStack_160;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy = local_158;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz = local_150;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz = local_148;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.Jxx =
       local_158 + local_150;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference(const double Jmyy,
                                                                            const double Jmzz,
                                                                            const double Jmyz,
                                                                            const double mass_phi,
                                                                            const double Qmy,
                                                                            const double Qmz) {
    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    // Jm_vec << Qmy, Qmz, Jmyy, Jmzz, Jmyz;
    Jm_vec(0) = Qmy;
    Jm_vec(1) = Qmz;
    Jm_vec(2) = Jmyy;
    Jm_vec(3) = Jmzz;
    Jm_vec(4) = Jmyz;

    // A constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // Transformation matrix from the mass center coordinate system to the centerline of beam
    EigenMat5x5 Acog2cl;
    Acog2cl.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acog2cl(0, 0) = cosphi;
    Acog2cl(0, 1) = sinphi;

    Acog2cl(1, 0) = -sinphi;
    Acog2cl(1, 1) = cosphi;

    Acog2cl(2, 0) = 2. * this->Mz * cosphi;
    Acog2cl(2, 1) = 2. * this->Mz * sinphi;
    Acog2cl(2, 2) = cosphi2;
    Acog2cl(2, 3) = sinphi2;
    Acog2cl(2, 4) = sin2phi;

    Acog2cl(3, 0) = -2. * this->My * sinphi;
    Acog2cl(3, 1) = 2. * this->My * cosphi;
    Acog2cl(3, 2) = sinphi2;
    Acog2cl(3, 3) = cosphi2;
    Acog2cl(3, 4) = -sin2phi;

    Acog2cl(4, 0) = this->My * cosphi - this->Mz * sinphi;
    Acog2cl(4, 1) = this->Mz * cosphi + this->My * sinphi;
    Acog2cl(4, 2) = -1. / 2. * sin2phi;
    Acog2cl(4, 3) = 1. / 2. * sin2phi;
    Acog2cl(4, 4) = cos2phi;

    EigenMat5x1 J_vec;
    J_vec.setZero();
    J_vec = const_vec + Acog2cl * Jm_vec;

    this->Qy = J_vec(0);
    this->Qz = J_vec(1);
    this->Jyy = J_vec(2);
    this->Jzz = J_vec(3);
    this->Jyz = J_vec(4);
    // Automatically set parent Jxx value
    this->Jxx = (this->Jyy + this->Jzz);
}